

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O1

bool __thiscall
Clasp::ShortImplicationsGraph::propagateBin
          (ShortImplicationsGraph *this,Assignment *out,Literal p,uint32 level)

{
  pointer pIVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  Antecedent local_40;
  uint32 *local_38;
  
  uVar5 = (ulong)(p.rep_ >> 1);
  pIVar1 = (this->graph_).ebo_.buf;
  uVar4 = (ulong)pIVar1[uVar5].super_ImpListBase.super_type.
                 super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                 left_;
  bVar6 = uVar4 == 0;
  if (!bVar6) {
    local_38 = (uint32 *)
               pIVar1[uVar5].super_ImpListBase.super_type.
               super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.buf_
    ;
    uVar5 = uVar5 << 0x21 | 2;
    local_40.data_ = uVar5;
    bVar2 = Assignment::assign(out,(Literal)*local_38,level,&local_40);
    if (bVar2) {
      uVar3 = 4;
      do {
        bVar6 = uVar4 == uVar3;
        if (bVar6) {
          return bVar6;
        }
        local_40.data_ = uVar5;
        bVar2 = Assignment::assign(out,(Literal)*(uint32 *)((long)local_38 + uVar3),level,&local_40)
        ;
        uVar3 = uVar3 + 4;
      } while (bVar2);
    }
  }
  return bVar6;
}

Assistant:

bool ShortImplicationsGraph::propagateBin(Assignment& out, Literal p, uint32 level) const {
	const ImplicationList& x = graph_[p.id()];
	Antecedent ante(p);
	for (ImplicationList::const_left_iterator it = x.left_begin(), end = x.left_end(); it != end; ++it) {
		if (!out.assign(*it, level, p)) { return false; }
	}
	return true;
}